

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

void redisFree(redisContext *c)

{
  redisContext *c_local;
  
  if (c != (redisContext *)0x0) {
    redisNetClose(c);
    sdsfree(c->obuf);
    redisReaderFree(c->reader);
    free((c->tcp).host);
    free((c->tcp).source_addr);
    free((c->unix_sock).path);
    free(c->timeout);
    free(c->saddr);
    if (c->funcs->free_privdata != (_func_void_void_ptr *)0x0) {
      (*c->funcs->free_privdata)(c->privdata);
    }
    memset(c,0xff,0xf0);
    free(c);
  }
  return;
}

Assistant:

void redisFree(redisContext *c) {
    if (c == NULL)
        return;
    redisNetClose(c);

    sdsfree(c->obuf);
    redisReaderFree(c->reader);
    free(c->tcp.host);
    free(c->tcp.source_addr);
    free(c->unix_sock.path);
    free(c->timeout);
    free(c->saddr);
    if (c->funcs->free_privdata) {
        c->funcs->free_privdata(c->privdata);
    }
    memset(c, 0xff, sizeof(*c));
    free(c);
}